

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

bool __thiscall graphics101::Mesh::writeToOBJ(Mesh *this,string *path)

{
  uint uVar1;
  pointer pTVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pTVar5;
  ostream *poVar6;
  pointer pTVar7;
  long lVar8;
  pointer pTVar9;
  ulong uVar10;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__range1;
  pointer pTVar11;
  char *pcVar12;
  pointer pTVar13;
  ulong uVar14;
  int vi;
  Triangle *face;
  vec<3,_float,_(glm::qualifier)0> *v;
  pointer pvVar15;
  pointer pvVar16;
  bool bVar17;
  ofstream out;
  char local_235;
  undefined4 local_234;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  pTVar5 = (this->face_normals).
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl
           .super__Vector_impl_data._M_start;
  pTVar7 = (this->face_normals).
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if ((pTVar7 == pTVar5) ||
     ((long)pTVar7 - (long)pTVar5 ==
      (long)(this->face_positions).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->face_positions).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    pTVar11 = (this->face_texcoords).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pTVar2 = (this->face_texcoords).
             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pTVar11 == pTVar2) {
      pTVar9 = (this->face_positions).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar13 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pTVar9 = (this->face_positions).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar13 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((long)pTVar11 - (long)pTVar2 != (long)pTVar13 - (long)pTVar9) {
        pcVar12 = 
        "ERROR: Faces for texture coordinates don\'t match faces for positions. Can\'t write mesh to OBJ.\n"
        ;
        lVar8 = 0x5f;
        goto LAB_0013f3e8;
      }
    }
    if (pTVar9 != pTVar13) {
      uVar14 = ((long)(this->positions).
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->positions).
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      bVar17 = true;
      do {
        lVar8 = 0;
        do {
          uVar1 = (&pTVar9->A)[lVar8];
          bVar17 = (bool)(bVar17 & -1 < (int)uVar1 & (uVar1 <= uVar14 && uVar14 - uVar1 != 0));
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar13);
      if (!bVar17) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n"
                   ,0x58);
        pTVar5 = (this->face_normals).
                 super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar7 = (this->face_normals).
                 super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (pTVar5 != pTVar7) {
      uVar14 = ((long)(this->normals).
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->normals).
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      bVar17 = true;
      do {
        lVar8 = 0;
        do {
          uVar1 = (&pTVar5->A)[lVar8];
          bVar17 = (bool)(bVar17 & -1 < (int)uVar1 & (uVar1 <= uVar14 && uVar14 - uVar1 != 0));
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 != pTVar7);
      if (!bVar17) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n"
                   ,0x56);
      }
    }
    pTVar5 = (this->face_texcoords).
             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar7 = (this->face_texcoords).
             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar5 != pTVar7) {
      bVar17 = true;
      do {
        lVar8 = 0;
        do {
          bVar17 = (bool)(bVar17 & -1 < (&pTVar5->A)[lVar8] &
                         (ulong)(uint)(&pTVar5->A)[lVar8] <
                         (ulong)((long)(this->texcoords).
                                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->texcoords).
                                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 != pTVar7);
      if (!bVar17) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n"
                   ,0x62);
      }
    }
    std::ofstream::ofstream(&local_230,(string *)path,_S_out);
    bVar17 = (abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0;
    local_234 = (undefined4)CONCAT71((int7)((ulong)*(long *)(local_230 + -0x18) >> 8),bVar17);
    if (bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"# OBJ written by Mesh::writeToOBJ()\n",0x24);
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x20;
      local_235 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_235,1);
      pvVar16 = (this->positions).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (this->positions).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar16 != pvVar3) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"v ",2);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar16->field_0).x);
          local_235 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar16->field_1).y);
          local_235 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar16->field_2).z);
          local_235 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          pvVar16 = pvVar16 + 1;
        } while (pvVar16 != pvVar3);
      }
      local_235 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_235,1);
      pvVar15 = (this->texcoords).
                super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (this->texcoords).
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar15 != pvVar4) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"vt ",3);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar15->field_0).x);
          local_235 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar15->field_1).y);
          local_235 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          pvVar15 = pvVar15 + 1;
        } while (pvVar15 != pvVar4);
      }
      local_235 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_235,1);
      pvVar16 = (this->normals).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (this->normals).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar16 != pvVar3) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"vn ",3);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar16->field_0).x);
          local_235 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar16->field_1).y);
          local_235 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          poVar6 = std::ostream::_M_insert<double>((double)(pvVar16->field_2).z);
          local_235 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
          pvVar16 = pvVar16 + 1;
        } while (pvVar16 != pvVar3);
      }
      local_235 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_235,1);
      pTVar5 = (this->face_normals).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar7 = (this->face_normals).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->face_texcoords).
          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->face_texcoords).
          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (pTVar5 == pTVar7) {
          pTVar5 = (this->face_positions).
                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pTVar7 = (this->face_positions).
                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pTVar5 != pTVar7) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
              poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pTVar5->A + 1);
              local_235 = ' ';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,pTVar5->B + 1);
              local_235 = ' ';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,pTVar5->C + 1);
              local_235 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              pTVar5 = pTVar5 + 1;
            } while (pTVar5 != pTVar7);
          }
        }
        else {
          pTVar5 = (this->face_positions).
                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->face_positions).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_finish != pTVar5) {
            lVar8 = 8;
            uVar14 = 0;
            do {
              pTVar7 = (this->face_normals).
                       super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = ((long)(this->face_normals).
                              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 2) *
                       -0x5555555555555555;
              if (uVar10 < uVar14 || uVar10 - uVar14 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
              poVar6 = (ostream *)
                       std::ostream::operator<<(&local_230,*(int *)((long)pTVar5 + lVar8 + -8) + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"//",2);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)pTVar7 + lVar8 + -8) + 1);
              local_235 = ' ';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)pTVar5 + lVar8 + -4) + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"//",2);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)pTVar7 + lVar8 + -4) + 1);
              local_235 = ' ';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)&pTVar5->A + lVar8) + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"//",2);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)&pTVar7->A + lVar8) + 1);
              local_235 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              uVar14 = uVar14 + 1;
              pTVar5 = (this->face_positions).
                       super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = ((long)(this->face_positions).
                              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 2) *
                       -0x5555555555555555;
              lVar8 = lVar8 + 0xc;
            } while (uVar14 <= uVar10 && uVar10 - uVar14 != 0);
          }
        }
      }
      else {
        pTVar11 = (this->face_positions).
                  super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar2 = (this->face_positions).
                 super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pTVar5 == pTVar7) {
          if (pTVar2 != pTVar11) {
            lVar8 = 8;
            uVar14 = 0;
            do {
              pTVar5 = (this->face_texcoords).
                       super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = ((long)(this->face_texcoords).
                              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 2) *
                       -0x5555555555555555;
              if (uVar10 < uVar14 || uVar10 - uVar14 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar14);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
              poVar6 = (ostream *)
                       std::ostream::operator<<(&local_230,*(int *)((long)pTVar11 + lVar8 + -8) + 1)
              ;
              local_235 = '/';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)pTVar5 + lVar8 + -8) + 1);
              local_235 = ' ';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)pTVar11 + lVar8 + -4) + 1);
              local_235 = '/';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)pTVar5 + lVar8 + -4) + 1);
              local_235 = ' ';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)&pTVar11->A + lVar8) + 1);
              local_235 = '/';
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,*(int *)((long)&pTVar5->A + lVar8) + 1);
              local_235 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
              uVar14 = uVar14 + 1;
              pTVar11 = (this->face_positions).
                        super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = ((long)(this->face_positions).
                              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 2) *
                       -0x5555555555555555;
              lVar8 = lVar8 + 0xc;
            } while (uVar14 <= uVar10 && uVar10 - uVar14 != 0);
          }
        }
        else if (pTVar2 != pTVar11) {
          lVar8 = 8;
          uVar14 = 0;
          do {
            pTVar5 = (this->face_texcoords).
                     super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = ((long)(this->face_texcoords).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 2) *
                     -0x5555555555555555;
            if (uVar10 < uVar14 || uVar10 - uVar14 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar14);
            }
            pTVar7 = (this->face_normals).
                     super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = ((long)(this->face_normals).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 2) *
                     -0x5555555555555555;
            if (uVar10 < uVar14 || uVar10 - uVar14 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
            poVar6 = (ostream *)
                     std::ostream::operator<<(&local_230,*(int *)((long)pTVar11 + lVar8 + -8) + 1);
            local_235 = '/';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)pTVar5 + lVar8 + -8) + 1);
            local_235 = '/';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)pTVar7 + lVar8 + -8) + 1);
            local_235 = ' ';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)pTVar11 + lVar8 + -4) + 1);
            local_235 = '/';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)pTVar5 + lVar8 + -4) + 1);
            local_235 = '/';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)pTVar7 + lVar8 + -4) + 1);
            local_235 = ' ';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)&pTVar11->A + lVar8) + 1);
            local_235 = '/';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)&pTVar5->A + lVar8) + 1);
            local_235 = '/';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(int *)((long)&pTVar7->A + lVar8) + 1);
            local_235 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
            uVar14 = uVar14 + 1;
            pTVar11 = (this->face_positions).
                      super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = ((long)(this->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11 >> 2) *
                     -0x5555555555555555;
            lVar8 = lVar8 + 0xc;
          } while (uVar14 <= uVar10 && uVar10 - uVar14 != 0);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: Could not open file for writing: ",0x28);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
      local_235 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_235,1);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _strftime;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  else {
    pcVar12 = 
    "ERROR: Faces for normals don\'t match faces for positions. Can\'t write mesh to OBJ.\n";
    lVar8 = 0x53;
LAB_0013f3e8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar8);
    local_234 = 0;
  }
  return SUB41(local_234,0);
}

Assistant:

bool Mesh::writeToOBJ( const std::string& path ) {
    using namespace std;
    
    if( face_normals.size() > 0 && face_normals.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for normals don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    if( face_texcoords.size() > 0 && face_texcoords.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for texture coordinates don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    
    // Check for valid position indices in face_positions.
    {
        bool valid_indices = true;
        for( const auto& f : face_positions ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= positions.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid normal indices in face_normals.
    {
        bool valid_indices = true;
        for( const auto& f : face_normals ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= normals.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid texture coordinate indices in face_texcoords.
    {
        bool valid_indices = true;
        for( const auto& f : face_texcoords ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= texcoords.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    
    // Open the file.
    ofstream out( path );
    if( !out ) {
        cerr << "ERROR: Could not open file for writing: " << path << '\n';
        return false;
    }
    
    out << "# OBJ written by Mesh::writeToOBJ()\n";
    out.precision( 32 );
    
    out << '\n';
    for( const auto& v : positions ) {
        out << "v " << v[0] << ' ' << v[1] << ' ' << v[2] << '\n';
    }
    
    out << '\n';
    for( const auto& vt : texcoords ) {
        out << "vt " << vt[0] << ' ' << vt[1] << '\n';
    }
    
    out << '\n';
    for( const auto& vn : normals ) {
        out << "vn " << vn[0] << ' ' << vn[1] << ' ' << vn[2] << '\n';
    }
    
    // OBJ's are 1-indexed, so add one to all indices.
    
    out << '\n';
    if( face_texcoords.empty() && face_normals.empty() ) {
        for( const auto& face : face_positions ) {
            out << "f " << face[0]+1 << ' ' << face[1]+1 << ' ' << face[2]+1 << '\n';
        }
    }
    else if( face_normals.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '\n';
        }
    }
    else if( face_texcoords.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << "//" << n[0]+1 << ' '
                << p[1]+1 << "//" << n[1]+1 << ' '
                << p[2]+1 << "//" << n[2]+1 << '\n';
        }
    }
    else {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << '/' << n[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << '/' << n[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '/' << n[2]+1 << '\n';
        }
    }

    return true;
}